

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O2

void add_keylist_command(nh_cmd_desc *cmd,nh_menuitem *item,wchar_t id)

{
  size_t sVar1;
  char *pcVar2;
  nh_cmd_desc **ppnVar3;
  long lVar4;
  char keys [256];
  char buf [256];
  char local_238 [255];
  undefined1 local_139;
  char local_138 [264];
  
  local_238[0] = '\0';
  ppnVar3 = keymap;
  for (lVar4 = 0; lVar4 != 0x1ff; lVar4 = lVar4 + 1) {
    if (*ppnVar3 == cmd) {
      sVar1 = strlen(local_238);
      if ((int)sVar1 == 0) {
        sVar1 = 0xff;
      }
      else {
        local_238[(int)sVar1] = ' ';
        local_238[(long)((sVar1 << 0x20) + 0x100000000) >> 0x20] = '\0';
        sVar1 = (long)(0xfe00000000 - (sVar1 << 0x20)) >> 0x20;
      }
      pcVar2 = curses_keyname((wchar_t)lVar4);
      strncat(local_238,pcVar2,sVar1);
      local_139 = 0;
    }
    ppnVar3 = ppnVar3 + 1;
  }
  pcVar2 = "#";
  if ((cmd->flags >> 10 & 1) == 0) {
    pcVar2 = "";
  }
  sprintf(local_138,"%s%.15s\t%.50s\t%.16s",pcVar2,cmd,cmd->desc,local_238);
  item->id = id;
  item->role = MI_NORMAL;
  item->accel = '\0';
  item->group_accel = '\0';
  item->selected = '\0';
  strcpy(item->caption,local_138);
  return;
}

Assistant:

static void add_keylist_command(struct nh_cmd_desc *cmd,
				struct nh_menuitem *item, int id)
{
    char buf[BUFSZ];
    char keys[BUFSZ];
    int i, kl;
    
    keys[0] = '\0';
    for (i = 0; i < KEY_MAX; i++) {
	if (keymap[i] == cmd) {
	    kl = strlen(keys);
	    if (kl) {
		keys[kl++] = ' ';
		keys[kl] = '\0';
	    }
	    strncat(keys, curses_keyname(i), BUFSZ - kl - 1);
	    keys[BUFSZ-1] = '\0';
	}
    }
    
    sprintf(buf, "%s%.15s\t%.50s\t%.16s", cmd->flags & CMD_EXT ? "#" : "",
	    cmd->name, cmd->desc, keys);
    set_menuitem(item, id, MI_NORMAL, buf, 0, FALSE);
}